

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetJavaMutableClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,EnumDescriptor *descriptor)

{
  bool in_CL;
  string local_40;
  
  (anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)descriptor,descriptor,in_CL);
  GetJavaClassFullName
            (__return_storage_ptr__,this,&local_40,*(FileDescriptor **)(descriptor + 0x10),false);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetJavaMutableClassName(
    const EnumDescriptor* descriptor) {
  return GetJavaClassFullName(ClassNameWithoutPackage(descriptor, false),
                              descriptor->file(), false);
}